

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.hpp
# Opt level: O1

IDeviceObject * __thiscall
Diligent::ShaderVariableManagerGL::TextureBindInfo::Get(TextureBindInfo *this,Uint32 ArrayIndex)

{
  ShaderVariableManagerGL *this_00;
  ShaderResourceCacheGL *this_01;
  PipelineResourceDesc *pPVar1;
  ResourceAttribs *pRVar2;
  CachedResourceView *pCVar3;
  char (*in_RCX) [28];
  string msg;
  string local_38;
  
  pPVar1 = GetResourceDesc((this->
                           super_GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo>)
                           .
                           super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                           .m_ParentManager,
                           (this->
                           super_GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo>)
                           .
                           super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                           .m_ResIndex);
  if (pPVar1->ArraySize <= ArrayIndex) {
    FormatString<char[26],char[28]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ArrayIndex < Desc.ArraySize",in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"Get",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderVariableManagerGL.hpp"
               ,0x96);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = (this->super_GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo>).
            super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
            .m_ParentManager;
  this_01 = (this_00->super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).
            m_ResourceCache;
  pRVar2 = GetResourceAttribs(this_00,(this->
                                      super_GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo>
                                      ).
                                      super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                                      .m_ResIndex);
  pCVar3 = ShaderResourceCacheGL::GetConstTexture(this_01,ArrayIndex + pRVar2->CacheOffset);
  return (pCVar3->pView).m_pObject;
}

Assistant:

Get(Uint32 ArrayIndex) const override final
        {
            const auto& Desc = GetDesc();
            VERIFY_EXPR(ArrayIndex < Desc.ArraySize);
            const auto& Tex = m_ParentManager.m_ResourceCache.GetConstTexture(GetAttribs().CacheOffset + ArrayIndex);
            return Tex.pView;
        }